

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O0

bool __thiscall test_CECoordinates::test_Convert2Cirs(test_CECoordinates *this)

{
  byte bVar1;
  long *in_RDI;
  undefined8 in_R9;
  double dVar2;
  double dVar3;
  CECoordinates *pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dut1;
  CEAngle *pCVar9;
  CEAngle *xcoord;
  double *dec_00;
  CECoordinates *this_00;
  CECoordinates obs2cirs;
  CECoordinates gal2cirs;
  CECoordinates icrs2cirs;
  CECoordinates cirs2cirs;
  double dec;
  double ra;
  undefined8 uVar10;
  CECoordinateType *pCVar11;
  undefined8 uVar12;
  CEAngle *pCVar13;
  undefined8 uVar14;
  CEAngle *pCVar15;
  CECoordinates *in_stack_fffffffffffffae0;
  CEAngleType *in_stack_fffffffffffffae8;
  CEDate *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  CECoordinates *in_stack_fffffffffffffb00;
  long *plVar16;
  double *in_stack_fffffffffffffb08;
  allocator *paVar17;
  double in_stack_fffffffffffffb10;
  CEAngleType *in_stack_fffffffffffffb60;
  CEObserver *in_stack_fffffffffffffb68;
  CEDate *in_stack_fffffffffffffb70;
  double *in_stack_fffffffffffffb78;
  double *in_stack_fffffffffffffb80;
  double in_stack_fffffffffffffb88;
  long *plVar18;
  double in_stack_fffffffffffffb90;
  CEAngleType *in_stack_fffffffffffffb98;
  long *plVar19;
  CEDate *in_stack_fffffffffffffba0;
  allocator *julian_date;
  double *in_stack_fffffffffffffba8;
  double *in_stack_fffffffffffffbb0;
  double *ra_00;
  double in_stack_fffffffffffffbb8;
  double in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffc18;
  double in_stack_fffffffffffffc20;
  double in_stack_fffffffffffffc28;
  double in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  double in_stack_fffffffffffffc40;
  double in_stack_fffffffffffffc48;
  double in_stack_fffffffffffffc50;
  CECoordinates *in_stack_fffffffffffffc58;
  double in_stack_fffffffffffffc70;
  double in_stack_fffffffffffffc78;
  double in_stack_fffffffffffffc80;
  undefined4 local_2e0;
  allocator local_2d9;
  string local_2d8 [36];
  undefined4 local_2b4;
  undefined4 local_290;
  allocator local_289;
  string local_288 [36];
  undefined4 local_264;
  undefined4 local_23c;
  undefined4 local_238;
  allocator local_231;
  string local_230 [32];
  undefined1 local_210 [48];
  undefined4 local_1e0;
  allocator local_1d9;
  string local_1d8 [36];
  undefined4 local_1b4;
  undefined4 local_18c;
  undefined4 local_188;
  allocator local_181;
  string local_180 [32];
  undefined1 local_160 [48];
  undefined4 local_130;
  allocator local_129;
  string local_128 [36];
  undefined4 local_104;
  undefined4 local_dc;
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [48];
  undefined4 local_80 [5];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [48];
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  CEDate::CurrentJD();
  uVar14 = 0x3fe0000000000000;
  uVar12 = 0;
  uVar10 = 0;
  CECoordinates::ConvertToCIRS
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"test_Convert2Cirs",&local_69);
  local_80[0] = 0xbe;
  (**(code **)(*in_RDI + 200))
            (in_RDI,local_48,in_RDI + 0x44,local_68,local_80,in_R9,uVar10,uVar12,uVar14);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  CEDate::operator_cast_to_double((CEDate *)0x11fb71);
  pCVar15 = (CEAngle *)0x3fe0000000000000;
  pCVar13 = (CEAngle *)0x0;
  pCVar11 = (CECoordinateType *)0x0;
  CECoordinates::ConvertToCIRS
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"test_Convert2Cirs",&local_d1);
  local_d8 = 0xc2;
  (**(code **)(*in_RDI + 200))(in_RDI,local_b0,in_RDI + 0x44,local_d0,&local_d8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  CppEphem::julian_date_J2000();
  CECoordinates::XCoordinate_Deg
            (in_stack_fffffffffffffb00,
             (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  CppEphem::julian_date_J2000();
  CECoordinates::YCoordinate_Deg
            (in_stack_fffffffffffffb00,
             (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  local_dc = 0;
  CECoordinates::ICRS2CIRS
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  local_104 = 0;
  CECoordinates::SetCoordinates(in_stack_fffffffffffffae0,pCVar15,pCVar13,pCVar11);
  CEAngle::~CEAngle((CEAngle *)0x11fdc5);
  CEAngle::~CEAngle((CEAngle *)0x11fdd2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"test_Convert2Cirs",&local_129);
  local_130 = 0xc9;
  (**(code **)(*in_RDI + 200))(in_RDI,local_b0,in_RDI + 0x44,local_128,&local_130);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  CEDate::operator_cast_to_double((CEDate *)0x11fe9b);
  pCVar15 = (CEAngle *)0x3fe0000000000000;
  pCVar13 = (CEAngle *)0x0;
  pCVar11 = (CECoordinateType *)0x0;
  CECoordinates::ConvertToCIRS
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"test_Convert2Cirs",&local_181);
  local_188 = 0xcd;
  (**(code **)(*in_RDI + 200))(in_RDI,local_160,in_RDI + 0x44,local_180,&local_188);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  local_10 = 0;
  local_18 = 0;
  plVar16 = in_RDI + 0x50;
  dVar2 = CppEphem::julian_date_J2000();
  dVar3 = CECoordinates::XCoordinate_Deg
                    (in_stack_fffffffffffffb00,
                     (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  CppEphem::julian_date_J2000();
  pCVar4 = (CECoordinates *)
           CECoordinates::YCoordinate_Deg
                     (in_stack_fffffffffffffb00,
                      (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  local_18c = 0;
  CECoordinates::Galactic2CIRS
            (in_stack_fffffffffffffb10,(double)in_stack_fffffffffffffb08,
             (double *)in_stack_fffffffffffffb00,
             (double *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  local_1b4 = 0;
  CECoordinates::SetCoordinates(in_stack_fffffffffffffae0,pCVar15,pCVar13,pCVar11);
  CEAngle::~CEAngle((CEAngle *)0x120107);
  CEAngle::~CEAngle((CEAngle *)0x120114);
  plVar19 = in_RDI + 0x44;
  paVar17 = &local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"test_Convert2Cirs",paVar17);
  local_1e0 = 0xd6;
  (**(code **)(*in_RDI + 200))(in_RDI,local_b0,plVar19,local_1d8,&local_1e0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  plVar18 = in_RDI + 0x56;
  dVar5 = CEDate::operator_cast_to_double((CEDate *)0x1201dd);
  dVar6 = CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 100));
  dVar7 = CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 100));
  dVar8 = CEObserver::Elevation_m((CEObserver *)(in_RDI + 100));
  dut1 = CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 100));
  CEObserver::Temperature_C((CEObserver *)(in_RDI + 100));
  CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 100));
  CEDate::dut1((CEDate *)0x1202b6);
  pCVar11 = (CECoordinateType *)CEDate::xpolar((CEDate *)0x1202d5);
  pCVar9 = (CEAngle *)CEDate::ypolar((CEDate *)0x1202f4);
  xcoord = (CEAngle *)CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  pCVar13 = xcoord;
  pCVar15 = pCVar9;
  CECoordinates::ConvertToCIRS
            (pCVar4,(double)paVar17,(double)plVar19,dVar5,(double)plVar18,dVar6,dVar7,dVar8,dut1,
             dVar3,(double)plVar16,dVar2);
  plVar16 = in_RDI + 0x44;
  paVar17 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"test_Convert2Cirs",paVar17);
  local_238 = 0xe5;
  (**(code **)(*in_RDI + 200))(in_RDI,local_210,plVar16,local_230,&local_238);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  local_10 = 0;
  local_18 = 0;
  dVar2 = CppEphem::julian_date_J2000();
  dVar3 = CECoordinates::XCoordinate_Deg
                    (in_stack_fffffffffffffb00,
                     (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  ra_00 = (double *)(in_RDI + 0x56);
  dVar5 = CppEphem::julian_date_J2000();
  dec_00 = (double *)
           CECoordinates::YCoordinate_Deg
                     (in_stack_fffffffffffffb00,
                      (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  local_23c = 0;
  CECoordinates::Observed2CIRS
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  CEAngle::Deg(in_stack_fffffffffffffb08);
  local_264 = 0;
  CECoordinates::SetCoordinates(in_stack_fffffffffffffae0,xcoord,pCVar9,pCVar11);
  CEAngle::~CEAngle((CEAngle *)0x1205bb);
  CEAngle::~CEAngle((CEAngle *)0x1205c8);
  plVar19 = in_RDI + 0x44;
  julian_date = &local_289;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"test_Convert2Cirs",julian_date);
  local_290 = 0xf0;
  (**(code **)(*in_RDI + 200))(in_RDI,local_210,plVar19,local_288,&local_290);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  local_10 = 0;
  local_18 = 0;
  plVar18 = in_RDI + 0x56;
  dVar6 = CppEphem::julian_date_J2000();
  dVar7 = CECoordinates::XCoordinate_Rad
                    (in_stack_fffffffffffffb00,
                     (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  dVar8 = CppEphem::julian_date_J2000();
  CECoordinates::YCoordinate_Rad
            (in_stack_fffffffffffffb00,
             (double)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  CEDate::JD((CEDate *)(in_RDI + 0x5c));
  CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Elevation_m((CEObserver *)(in_RDI + 100));
  CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 100));
  CEObserver::Temperature_C((CEObserver *)(in_RDI + 100));
  pCVar11 = (CECoordinateType *)CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 100));
  pCVar4 = (CECoordinates *)CEDate::dut1((CEDate *)0x1207f6);
  pCVar9 = (CEAngle *)CEDate::xpolar((CEDate *)0x120812);
  this_00 = (CECoordinates *)CEDate::ypolar((CEDate *)0x12082e);
  CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  CECoordinates::Observed2CIRS
            (dVar3,dVar5,ra_00,dec_00,(double)julian_date,(double)plVar19,dVar6,(double)plVar18,
             dVar7,dVar8,dVar2,(double)plVar16,(double)paVar17,(double)pCVar13,(double)pCVar15);
  CEAngle::Rad(in_stack_fffffffffffffb08);
  CEAngle::Rad(in_stack_fffffffffffffb08);
  local_2b4 = 0;
  CECoordinates::SetCoordinates(this_00,pCVar9,(CEAngle *)pCVar4,pCVar11);
  CEAngle::~CEAngle((CEAngle *)0x12095b);
  CEAngle::~CEAngle((CEAngle *)0x120968);
  plVar16 = in_RDI + 0x44;
  paVar17 = &local_2d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"test_Convert2Cirs",paVar17);
  local_2e0 = 0x104;
  (**(code **)(*in_RDI + 200))(in_RDI,local_210,plVar16,local_2d8,&local_2e0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CECoordinates::~CECoordinates(pCVar4);
  CECoordinates::~CECoordinates(pCVar4);
  CECoordinates::~CECoordinates(pCVar4);
  CECoordinates::~CECoordinates(pCVar4);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CECoordinates::test_Convert2Cirs()
{
    double ra(0.0);
    double dec(0.0);

    // CIRS -> CIRS
    CECoordinates cirs2cirs = base_cirs_.ConvertToCIRS();
    test_coords(cirs2cirs, base_cirs_, __func__, __LINE__);

    // ICRS -> CIRS
    CECoordinates icrs2cirs = base_icrs_.ConvertToCIRS(base_date_);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    CECoordinates::ICRS2CIRS(base_icrs_.XCoordinate_Deg(), 
                             base_icrs_.YCoordinate_Deg(),
                             &ra, &dec, base_date_, CEAngleType::DEGREES);
    icrs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    // Galactic -> CIRS
    CECoordinates gal2cirs = base_gal_.ConvertToCIRS(base_date_);
    test_coords(gal2cirs, base_cirs_, __func__, __LINE__);

    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Galactic2CIRS(base_gal_.XCoordinate_Deg(), 
                                 base_gal_.YCoordinate_Deg(),
                                 &ra, &dec, base_date_, CEAngleType::DEGREES);
    icrs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS
    CECoordinates obs2cirs = base_obs_.ConvertToCIRS(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS (direct v1)
    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Observed2CIRS(base_obs_.XCoordinate_Deg(), 
                                 base_obs_.YCoordinate_Deg(),
                                 &ra, &dec, base_date_, base_observer_,
                                 CEAngleType::DEGREES);
    obs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS (direct v2)
    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Observed2CIRS(base_obs_.XCoordinate_Rad(), 
                                 base_obs_.YCoordinate_Rad(),
                                 &ra, &dec, base_date_.JD(), 
                                 base_observer_.Longitude_Rad(),
                                 base_observer_.Latitude_Rad(),
                                 base_observer_.Elevation_m(),
                                 base_observer_.Pressure_hPa(),
                                 base_observer_.Temperature_C(),
                                 base_observer_.RelativeHumidity(),
                                 base_date_.dut1(),
                                 base_date_.xpolar(),
                                 base_date_.ypolar(),
                                 base_observer_.Wavelength_um());
    obs2cirs.SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec), 
                             CECoordinateType::CIRS);
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    return pass();
}